

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBmc2.c
# Opt level: O1

int Saig_BmcPerform(Aig_Man_t *pAig,int nStart,int nFramesMax,int nNodesMax,int nTimeOut,
                   int nConfMaxOne,int nConfMaxAll,int fVerbose,int fVerbOverwrite,int *piFrames,
                   int fSilent,int fUseSatoko)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  Saig_Bmc_t *p;
  Aig_Man_t *pAig_00;
  Cnf_Dat_t *p_00;
  long lVar7;
  ulong uVar8;
  int iVar9;
  char *pcVar10;
  long lVar11;
  bool bVar12;
  timespec local_70;
  uint local_5c;
  uint local_58;
  int local_54;
  long local_50;
  long local_48;
  uint local_40;
  int local_3c;
  long local_38;
  
  local_54 = 0;
  local_3c = nStart;
  if (nTimeOut == 0) {
    lVar11 = 0;
  }
  else {
    local_5c = nFramesMax;
    iVar3 = clock_gettime(3,&local_70);
    if (iVar3 < 0) {
      lVar11 = -1;
    }
    else {
      lVar11 = local_70.tv_nsec / 1000 + local_70.tv_sec * 1000000;
    }
    lVar11 = lVar11 + (long)nTimeOut * 1000000;
    nFramesMax = local_5c;
  }
  iVar3 = clock_gettime(3,&local_70);
  local_38 = 1;
  local_50 = 1;
  if (-1 < iVar3) {
    lVar7 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_70.tv_nsec),8);
    local_50 = ((lVar7 >> 7) - (lVar7 >> 0x3f)) + local_70.tv_sec * -1000000;
  }
  local_48 = lVar11;
  iVar3 = clock_gettime(3,&local_70);
  if (-1 < iVar3) {
    lVar11 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_70.tv_nsec),8);
    local_38 = ((lVar11 >> 7) - (lVar11 >> 0x3f)) + local_70.tv_sec * -1000000;
  }
  local_58 = nTimeOut;
  if (fVerbose != 0) {
    uVar5 = pAig->nRegs;
    uVar1 = pAig->nTruePis;
    uVar2 = pAig->nTruePos;
    iVar3 = pAig->nObjs[6];
    iVar9 = pAig->nObjs[5];
    local_5c = nNodesMax;
    local_40 = nConfMaxOne;
    uVar4 = Aig_ManLevelNum(pAig);
    nConfMaxOne = local_40;
    nTimeOut = local_58;
    nNodesMax = local_5c;
    printf("Running \"bmc2\". AIG:  PI/PO/Reg = %d/%d/%d.  Node = %6d. Lev = %5d.\n",(ulong)uVar1,
           (ulong)uVar2,(ulong)uVar5,(ulong)(uint)(iVar3 + iVar9),(ulong)uVar4);
    printf("Params: FramesMax = %d. NodesDelta = %d. ConfMaxOne = %d. ConfMaxAll = %d.\n",
           (ulong)(uint)nFramesMax,(ulong)(uint)nNodesMax,(ulong)(uint)nConfMaxOne,
           (ulong)(uint)nConfMaxAll);
  }
  uVar5 = 1000000000;
  if (nFramesMax != 0) {
    uVar5 = nFramesMax;
  }
  p = Saig_BmcManStart(pAig,uVar5,nNodesMax,nConfMaxOne,nConfMaxAll,fVerbose,fUseSatoko);
  lVar11 = local_48;
  if (nTimeOut != 0) {
    if (p->pSat2 == (satoko_t *)0x0) {
      p->pSat->nRuntimeLimit = local_48;
    }
    else {
      satoko_set_runtime_limit(p->pSat2,local_48);
    }
  }
  clock_gettime(3,&local_70);
  Saig_BmcInterval(p);
  bVar12 = false;
  if (p->vTargets->nSize != 0) {
    uVar8 = 0;
    do {
      pAig_00 = Saig_BmcIntervalToAig(p);
      p_00 = Cnf_Derive(pAig_00,pAig_00->nObjs[3]);
      Cnf_DataLift(p_00,p->nSatVars);
      p->nSatVars = p->nSatVars + p_00->nVars;
      Saig_BmcLoadCnf(p,p_00);
      Cnf_DataFree(p_00);
      Aig_ManStop(pAig_00);
      uVar5 = Saig_BmcSolveTargets(p,local_3c,&local_54);
      if (fVerbose != 0) {
        uVar1 = p->iFrameLast;
        uVar2 = p->iOutputLast;
        iVar3 = p->pFrm->nObjs[6];
        iVar9 = p->pFrm->nObjs[5];
        uVar4 = p->nSatVars;
        local_5c = uVar5;
        if (p->pSat == (sat_solver *)0x0) {
          iVar6 = satoko_conflictnum(p->pSat2);
        }
        else {
          iVar6 = (int)(p->pSat->stats).conflicts;
        }
        printf("%4d : F =%5d. O =%4d.  And =%8d. Var =%8d. Conf =%7d. ",uVar8,(ulong)uVar1,
               (ulong)uVar2,(ulong)(uint)(iVar3 + iVar9),(ulong)uVar4,iVar6);
        printf("%4.0f MB",(double)p->nObjs * (double)(p->iFrameLast + 1) * 4.0 * 9.5367431640625e-07
              );
        iVar3 = clock_gettime(3,&local_70);
        lVar11 = local_48;
        nTimeOut = local_58;
        if (iVar3 < 0) {
          lVar7 = -1;
        }
        else {
          lVar7 = local_70.tv_nsec / 1000 + local_70.tv_sec * 1000000;
        }
        printf("%9.2f sec",(double)((float)(lVar7 + local_38) / 1e+06));
        putchar(10);
        fflush(_stdout);
        uVar5 = local_5c;
      }
      if (uVar5 != 0xffffffff) goto LAB_0055cdfa;
      if (nTimeOut != 0) {
        iVar3 = clock_gettime(3,&local_70);
        if (iVar3 < 0) {
          lVar7 = -1;
        }
        else {
          lVar7 = local_70.tv_nsec / 1000 + local_70.tv_sec * 1000000;
        }
        if (lVar11 < lVar7) {
          if (fSilent == 0) {
            printf("Reached timeout (%d seconds).\n",(ulong)(uint)nTimeOut);
          }
          if (piFrames != (int *)0x0) {
            *piFrames = p->iFrameLast + -1;
          }
          Saig_BmcManStop(p);
          return -1;
        }
      }
      uVar8 = (ulong)((int)uVar8 + 1);
      clock_gettime(3,&local_70);
      Saig_BmcInterval(p);
    } while (p->vTargets->nSize != 0);
    uVar5 = 0xffffffff;
LAB_0055cdfa:
    bVar12 = uVar5 == 1;
  }
  if (bVar12) {
    if (p->pAig->nTruePos * p->iFrameFail + p->iOutputFail + 1 != local_54) {
      __assert_fail("p->iFrameFail * Saig_ManPoNum(p->pAig) + p->iOutputFail + 1 == nOutsSolved",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bmc/bmcBmc2.c"
                    ,0x37a,
                    "int Saig_BmcPerform(Aig_Man_t *, int, int, int, int, int, int, int, int, int *, int, int)"
                   );
    }
    if (fSilent == 0) {
      Abc_Print(0,"Output %d of miter \"%s\" was asserted in frame %d. ",(ulong)(uint)p->iOutputFail
                ,p->pAig->pName);
    }
    if (piFrames == (int *)0x0) {
      iVar9 = 0;
    }
    else {
      iVar3 = p->iFrameFail + -1;
      iVar9 = 0;
LAB_0055cf08:
      *piFrames = iVar3;
    }
  }
  else {
    if (fSilent == 0) {
      iVar3 = 1;
      if (1 < p->iFramePrev) {
        iVar3 = p->iFramePrev;
      }
      Abc_Print(0,"No output failed in %d frames.  ",(ulong)(iVar3 - 1));
    }
    if (piFrames != (int *)0x0) {
      if (p->iOutputLast < 1) {
        iVar3 = p->iFramePrev + -1;
      }
      else {
        iVar3 = p->iFramePrev + -2;
      }
      iVar9 = -1;
      goto LAB_0055cf08;
    }
    iVar9 = -1;
  }
  if (fSilent != 0) goto LAB_0055d0a6;
  Abc_Print(0,"%s =","Time");
  iVar3 = 3;
  if (fVerbOverwrite == 0) {
    iVar6 = clock_gettime(3,&local_70);
    if (iVar6 < 0) {
      lVar11 = -1;
    }
    else {
      lVar11 = local_70.tv_nsec / 1000 + local_70.tv_sec * 1000000;
    }
    pcVar10 = "%9.2f sec\n";
  }
  else {
    iVar6 = clock_gettime(3,&local_70);
    if (iVar6 < 0) {
      lVar11 = -1;
    }
    else {
      lVar11 = local_70.tv_nsec / 1000 + local_70.tv_sec * 1000000;
    }
    pcVar10 = "%9.2f sec\r";
  }
  Abc_Print(iVar3,pcVar10,(double)(local_50 + lVar11) / 1000000.0);
  if (bVar12) goto LAB_0055d0a6;
  uVar8 = (ulong)(uint)p->nFramesMax;
  if (p->iFrameLast < p->nFramesMax) {
    if (p->nConfMaxAll != 0) {
      if (p->pSat == (sat_solver *)0x0) {
        iVar3 = satoko_conflictnum(p->pSat2);
      }
      else {
        iVar3 = (int)(p->pSat->stats).conflicts;
      }
      uVar8 = (ulong)(uint)p->nConfMaxAll;
      if (p->nConfMaxAll < iVar3) {
        pcVar10 = "Reached global conflict limit (%d).\n";
        goto LAB_0055d09f;
      }
    }
    if (nTimeOut != 0) {
      iVar3 = clock_gettime(3,&local_70);
      if (iVar3 < 0) {
        lVar11 = -1;
      }
      else {
        lVar11 = local_70.tv_nsec / 1000 + local_70.tv_sec * 1000000;
      }
      if (local_48 < lVar11) {
        pcVar10 = "Reached timeout (%d seconds).\n";
        uVar8 = (ulong)(uint)nTimeOut;
        goto LAB_0055d09f;
      }
    }
    uVar8 = (ulong)(uint)p->nConfMaxOne;
    pcVar10 = "Reached local conflict limit (%d).\n";
  }
  else {
    pcVar10 = "Reached limit on the number of timeframes (%d).\n";
  }
LAB_0055d09f:
  printf(pcVar10,uVar8);
LAB_0055d0a6:
  Saig_BmcManStop(p);
  fflush(_stdout);
  return iVar9;
}

Assistant:

int Saig_BmcPerform( Aig_Man_t * pAig, int nStart, int nFramesMax, int nNodesMax, int nTimeOut, int nConfMaxOne, int nConfMaxAll, int fVerbose, int fVerbOverwrite, int * piFrames, int fSilent, int fUseSatoko )
{
    Saig_Bmc_t * p;
    Aig_Man_t * pNew;
    Cnf_Dat_t * pCnf;
    int nOutsSolved = 0;
    int Iter, RetValue = -1;
    abctime nTimeToStop = nTimeOut ? nTimeOut * CLOCKS_PER_SEC + Abc_Clock(): 0;
    abctime clk = Abc_Clock(), clk2, clkTotal = Abc_Clock();
    int Status = -1;
/*
    Vec_Ptr_t * vSimInfo;
    vSimInfo = Abs_ManTernarySimulate( pAig, nFramesMax, fVerbose );
    Abs_ManFreeAray( vSimInfo );
*/
    if ( fVerbose )
    {
        printf( "Running \"bmc2\". AIG:  PI/PO/Reg = %d/%d/%d.  Node = %6d. Lev = %5d.\n", 
            Saig_ManPiNum(pAig), Saig_ManPoNum(pAig), Saig_ManRegNum(pAig),
            Aig_ManNodeNum(pAig), Aig_ManLevelNum(pAig) );
        printf( "Params: FramesMax = %d. NodesDelta = %d. ConfMaxOne = %d. ConfMaxAll = %d.\n", 
            nFramesMax, nNodesMax, nConfMaxOne, nConfMaxAll );
    } 
    nFramesMax = nFramesMax ? nFramesMax : ABC_INFINITY;
    p = Saig_BmcManStart( pAig, nFramesMax, nNodesMax, nConfMaxOne, nConfMaxAll, fVerbose, fUseSatoko );
    // set runtime limit
    if ( nTimeOut )
    {
        if ( p->pSat2 )
            satoko_set_runtime_limit( p->pSat2, nTimeToStop );
        else
            sat_solver_set_runtime_limit( p->pSat, nTimeToStop );
    }
    for ( Iter = 0; ; Iter++ )
    {
        clk2 = Abc_Clock();
        // add new logic interval to frames
        Saig_BmcInterval( p );
//        Saig_BmcAddTargetsAsPos( p );
        if ( Vec_PtrSize(p->vTargets) == 0 )
            break;
        // convert logic slice into new AIG
        pNew = Saig_BmcIntervalToAig( p );
//printf( "StitchVars = %d.\n", p->nStitchVars );
        // derive CNF for the new AIG
        pCnf = Cnf_Derive( pNew, Aig_ManCoNum(pNew) );
        Cnf_DataLift( pCnf, p->nSatVars );
        p->nSatVars += pCnf->nVars;
        // add this CNF to the solver
        Saig_BmcLoadCnf( p, pCnf );
        Cnf_DataFree( pCnf );
        Aig_ManStop( pNew );
        // solve the targets
        RetValue = Saig_BmcSolveTargets( p, nStart, &nOutsSolved );
        if ( fVerbose )
        {
            printf( "%4d : F =%5d. O =%4d.  And =%8d. Var =%8d. Conf =%7d. ", 
                Iter, p->iFrameLast, p->iOutputLast, Aig_ManNodeNum(p->pFrm), p->nSatVars, 
                p->pSat ? (int)p->pSat->stats.conflicts : satoko_conflictnum(p->pSat2) );   
            printf( "%4.0f MB",     4.0*(p->iFrameLast+1)*p->nObjs/(1<<20) );
            printf( "%9.2f sec", (float)(Abc_Clock() - clkTotal)/(float)(CLOCKS_PER_SEC) );
            printf( "\n" );
            fflush( stdout );
        }
        if ( RetValue != l_False )
            break;
        // check the timeout
        if ( nTimeOut && Abc_Clock() > nTimeToStop )
        {
            if ( !fSilent )
                printf( "Reached timeout (%d seconds).\n",  nTimeOut );
            if ( piFrames )
                *piFrames = p->iFrameLast-1;
            Saig_BmcManStop( p );
            return Status;
        }
    }
    if ( RetValue == l_True )
    {
        assert( p->iFrameFail * Saig_ManPoNum(p->pAig) + p->iOutputFail + 1 == nOutsSolved );
        if ( !fSilent )
            Abc_Print( 1, "Output %d of miter \"%s\" was asserted in frame %d. ", 
                p->iOutputFail, p->pAig->pName, p->iFrameFail );
        Status = 0;
        if ( piFrames )
            *piFrames = p->iFrameFail - 1;
    }
    else // if ( RetValue == l_False || RetValue == l_Undef )
    {
        if ( !fSilent )
            Abc_Print( 1, "No output failed in %d frames.  ", Abc_MaxInt(p->iFramePrev-1, 0) );
        if ( piFrames )
        {
            if ( p->iOutputLast > 0 )
                *piFrames = p->iFramePrev - 2;
            else
                *piFrames = p->iFramePrev - 1;
        }
    }
    if ( !fSilent )
    {
        if ( fVerbOverwrite )
        {
            ABC_PRTr( "Time", Abc_Clock() - clk );
        }
        else
        {
            ABC_PRT( "Time", Abc_Clock() - clk );
        }
        if ( RetValue != l_True )
        {
            if ( p->iFrameLast >= p->nFramesMax )
                printf( "Reached limit on the number of timeframes (%d).\n", p->nFramesMax );
            else if ( p->nConfMaxAll && (p->pSat ? (int)p->pSat->stats.conflicts : satoko_conflictnum(p->pSat2)) > p->nConfMaxAll )
                printf( "Reached global conflict limit (%d).\n", p->nConfMaxAll );
            else if ( nTimeOut && Abc_Clock() > nTimeToStop )
                printf( "Reached timeout (%d seconds).\n", nTimeOut );
            else
                printf( "Reached local conflict limit (%d).\n", p->nConfMaxOne );
        }
    }
    Saig_BmcManStop( p );
    fflush( stdout );
    return Status;
}